

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O1

bool __thiscall
S2ContainsPointQuery<MutableS2ShapeIndex>::VisitContainingShapes
          (S2ContainsPointQuery<MutableS2ShapeIndex> *this,S2Point *p,ShapeVisitor_conflict *visitor
          )

{
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  bool bVar1;
  const_reference clipped;
  size_type_conflict n;
  uint uVar2;
  __uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_> local_38;
  
  bVar1 = MutableS2ShapeIndex::Iterator::Locate(&this->it_,p);
  if (bVar1) {
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              (this->it_).super_IteratorBase.cell_._M_b._M_p;
    uVar2 = *(uint *)&this_00->field_0x0 & 0xffffff;
    if (uVar2 == 0) {
      return uVar2 == 0;
    }
    n = 0;
    do {
      clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                          (this_00,n);
      bVar1 = ShapeContains(this,&this->it_,clipped,p);
      if (bVar1) {
        local_38._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
        super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
             (this->index_->shapes_).
             super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[clipped->shape_id_]._M_t.
             super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t;
        if ((visitor->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar1 = (*visitor->_M_invoker)((_Any_data *)visitor,(S2Shape **)&local_38._M_t);
        if (!bVar1) {
          return false;
        }
      }
      n = n + 1;
    } while (uVar2 != n);
  }
  return true;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::VisitContainingShapes(
    const S2Point& p, const ShapeVisitor& visitor) {
  // This function returns "false" only if the algorithm terminates early
  // because the "visitor" function returned false.
  if (!it_.Locate(p)) return true;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    if (ShapeContains(it_, clipped, p) &&
        !visitor(index_->shape(clipped.shape_id()))) {
      return false;
    }
  }
  return true;
}